

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listenable_impl.hpp
# Opt level: O1

void __thiscall
wigwag::detail::
listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
::handler_node::release_token_impl(handler_node *this)

{
  atomic<int> *paVar1;
  code *pcVar2;
  listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
  *plVar3;
  intrusive_list_node *piVar4;
  int iVar5;
  
  life_assurance::intrusive_life_tokens::life_assurance::release_life_assurance
            (&this->super_life_assurance,&((this->_listenable_impl)._raw)->super_shared_data);
  (*(this->super_implementation)._vptr_implementation[3])(this);
  pcVar2 = *(code **)((long)&this->_handler + 0x10);
  if (pcVar2 != (code *)0x0) {
    (*pcVar2)(&this->_handler,&this->_handler,3);
  }
  LOCK();
  paVar1 = &(this->super_life_assurance)._ref_count;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
  UNLOCK();
  if ((paVar1->super___atomic_base<int>)._M_i == 0) {
    iVar5 = pthread_mutex_lock((pthread_mutex_t *)
                               &((this->_listenable_impl)._raw)->super_lock_primitive);
    if (iVar5 == 0) {
      plVar3 = (this->_listenable_impl)._raw;
      piVar4 = (this->super_intrusive_list_node)._next;
      piVar4->_prev = (this->super_intrusive_list_node)._prev;
      ((this->super_intrusive_list_node)._prev)->_next = piVar4;
      (this->super_intrusive_list_node)._next = &this->super_intrusive_list_node;
      (this->super_intrusive_list_node)._prev = &this->super_intrusive_list_node;
      pthread_mutex_unlock((pthread_mutex_t *)&plVar3->super_lock_primitive);
      (*(this->super_implementation)._vptr_implementation[2])(this);
      return;
    }
    std::__throw_system_error(iVar5);
  }
  return;
}

Assistant:

virtual void release_token_impl()
            {
                life_assurance::release_life_assurance(*_listenable_impl);

                if (!suppress_populator() && _listenable_impl->get_handler_processor().has_withdraw_state())
                {
                    _listenable_impl->get_lock_primitive().lock_nonrecursive();
                    auto sg = detail::at_scope_exit([&] { _listenable_impl->get_lock_primitive().unlock_nonrecursive(); } );
                    _listenable_impl->get_handler_processor().withdraw_state(_handler.ref());
                }

                _handler.ref().~handler_type();

                if (life_assurance::release_node())
                {
                    {
                        _listenable_impl->get_lock_primitive().lock_nonrecursive();
                        auto sg = detail::at_scope_exit([&] { _listenable_impl->get_lock_primitive().unlock_nonrecursive(); } );
                        _listenable_impl->get_handlers_container().erase(*this);
                    }
                    delete this;
                }
            }